

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

bignum_t<10> __thiscall bignum_t<10>::operator-(bignum_t<10> *this)

{
  bignum_t<10> bVar1;
  bignum_t<10> result;
  bignum_t<10> local_18;
  
  bignum_t<10>(&local_18,this);
  if ((local_18.ext[4] & 8U) == 0) {
    local_18.ext[4] = local_18.ext[4] ^ 1;
  }
  bVar1.ext[0] = local_18.ext[0];
  bVar1.ext[1] = local_18.ext[1];
  bVar1.ext[2] = local_18.ext[2];
  bVar1.ext[3] = local_18.ext[3];
  bVar1.ext[4] = local_18.ext[4];
  bVar1.ext[5] = local_18.ext[5];
  bVar1.ext[6] = local_18.ext[6];
  bVar1.ext[7] = local_18.ext[7];
  bVar1.ext[8] = local_18.ext[8];
  bVar1.ext[9] = local_18.ext[9];
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t<prec> operator -()
    {
        bignum_t<prec> result(this);
        CVmObjBigNum::negate(result.ext);
        return result;
    }